

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
CP::vector<std::pair<int,_int>_>::vector
          (vector<std::pair<int,_int>_> *this,vector<std::pair<int,_int>_> *a)

{
  undefined1 auVar1 [16];
  size_t sVar2;
  ulong uVar3;
  pair<int,_int> *ppVar4;
  pair<int,_int> *local_58;
  ulong local_30;
  size_t i;
  vector<std::pair<int,_int>_> *a_local;
  vector<std::pair<int,_int>_> *this_local;
  
  sVar2 = capacity(a);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = sVar2;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  ppVar4 = (pair<int,_int> *)operator_new__(uVar3);
  if (sVar2 != 0) {
    local_58 = ppVar4;
    do {
      std::pair<int,_int>::pair<int,_int,_true>(local_58);
      local_58 = local_58 + 1;
    } while (local_58 != ppVar4 + sVar2);
  }
  this->mData = ppVar4;
  sVar2 = capacity(a);
  this->mCap = sVar2;
  sVar2 = size(a);
  this->mSize = sVar2;
  local_30 = 0;
  while( true ) {
    sVar2 = size(a);
    if (sVar2 <= local_30) break;
    ppVar4 = operator[](a,(int)local_30);
    std::pair<int,_int>::operator=(this->mData + local_30,ppVar4);
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

vector(const vector<T>& a) {
      mData = new T[a.capacity()]();
      mCap = a.capacity();
      mSize = a.size();
      for (size_t i = 0;i < a.size();i++) {
        mData[i] = a[i];
      }
    }